

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

QModelIndex * __thiscall
QCompletionModel::currentIndex
          (QModelIndex *__return_storage_ptr__,QCompletionModel *this,bool sourceIndex)

{
  bool bVar1;
  QCompletionEngine *pQVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  int local_28;
  int local_24;
  undefined8 local_20;
  QCompletionModel *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->engine).d;
  bVar1 = (pQVar2->curMatch).indices.v;
  if (bVar1 == true) {
    iVar3 = (int)(pQVar2->curMatch).indices.vector.d.size;
  }
  else {
    iVar3 = ((pQVar2->curMatch).indices.t - (pQVar2->curMatch).indices.f) + 1;
  }
  if ((pQVar2->historyMatch).indices.v == true) {
    iVar4 = (int)(pQVar2->historyMatch).indices.vector.d.size;
  }
  else {
    iVar4 = ((pQVar2->historyMatch).indices.t - (pQVar2->historyMatch).indices.f) + 1;
  }
  if (iVar4 + iVar3 == 0) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
LAB_00648290:
      __stack_chk_fail();
    }
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
  else {
    local_28 = pQVar2->curRow;
    if (this->showAll == true) {
      if (bVar1 == false) {
        local_28 = local_28 + (pQVar2->curMatch).indices.f;
      }
      else {
        local_28 = (pQVar2->curMatch).indices.vector.d.ptr[local_28];
      }
    }
    local_24 = this->c->column;
    local_20 = 0;
    local_18 = this;
    if (sourceIndex) {
      (**(code **)(*(long *)this + 400))(__return_storage_ptr__,this,&local_28);
    }
    else {
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)this;
      __return_storage_ptr__->r = local_28;
      __return_storage_ptr__->c = local_24;
      __return_storage_ptr__->i = 0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_10) goto LAB_00648290;
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QCompletionModel::currentIndex(bool sourceIndex) const
{
    if (!engine->matchCount())
        return QModelIndex();

    int row = engine->curRow;
    if (showAll)
        row = engine->curMatch.indices[engine->curRow];

    QModelIndex idx = createIndex(row, c->column);
    if (!sourceIndex)
        return idx;
    return mapToSource(idx);
}